

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_reflect.cpp
# Opt level: O1

void __thiscall spirv_cross::CompilerReflection::emit_resources(CompilerReflection *this)

{
  ShaderResources res;
  ShaderResources local_1870;
  
  Compiler::get_shader_resources(&local_1870,(Compiler *)this);
  emit_resources(this,"subpass_inputs",&local_1870.subpass_inputs);
  emit_resources(this,"inputs",&local_1870.stage_inputs);
  emit_resources(this,"outputs",&local_1870.stage_outputs);
  emit_resources(this,"textures",&local_1870.sampled_images);
  emit_resources(this,"separate_images",&local_1870.separate_images);
  emit_resources(this,"separate_samplers",&local_1870.separate_samplers);
  emit_resources(this,"images",&local_1870.storage_images);
  emit_resources(this,"ssbos",&local_1870.storage_buffers);
  emit_resources(this,"ubos",&local_1870.uniform_buffers);
  emit_resources(this,"push_constants",&local_1870.push_constant_buffers);
  emit_resources(this,"counters",&local_1870.atomic_counters);
  emit_resources(this,"acceleration_structures",&local_1870.acceleration_structures);
  ShaderResources::~ShaderResources(&local_1870);
  return;
}

Assistant:

void CompilerReflection::emit_resources()
{
	auto res = get_shader_resources();
	emit_resources("subpass_inputs", res.subpass_inputs);
	emit_resources("inputs", res.stage_inputs);
	emit_resources("outputs", res.stage_outputs);
	emit_resources("textures", res.sampled_images);
	emit_resources("separate_images", res.separate_images);
	emit_resources("separate_samplers", res.separate_samplers);
	emit_resources("images", res.storage_images);
	emit_resources("ssbos", res.storage_buffers);
	emit_resources("ubos", res.uniform_buffers);
	emit_resources("push_constants", res.push_constant_buffers);
	emit_resources("counters", res.atomic_counters);
	emit_resources("acceleration_structures", res.acceleration_structures);
}